

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Bool storeRawNames(XML_Parser parser)

{
  char *pcVar1;
  XML_Char *pXVar2;
  int iVar3;
  XML_Char *pXVar4;
  long lVar5;
  size_t sVar6;
  TAG *pTVar7;
  char *__dest;
  
  pTVar7 = parser->m_tagStack;
  do {
    if (pTVar7 == (TAG *)0x0) {
      return '\x01';
    }
    lVar5 = (long)(pTVar7->name).strLen;
    pcVar1 = pTVar7->buf;
    __dest = pcVar1 + lVar5 + 1;
    if (pTVar7->rawName == __dest) {
      iVar3 = 3;
    }
    else {
      lVar5 = lVar5 + 1;
      sVar6 = (size_t)(pTVar7->rawNameLength + (int)lVar5);
      if ((long)pTVar7->bufEnd - (long)pcVar1 < (long)sVar6) {
        pXVar4 = (XML_Char *)(*(parser->m_mem).realloc_fcn)(pcVar1,sVar6);
        if (pXVar4 != (XML_Char *)0x0) {
          pcVar1 = pTVar7->buf;
          if ((pTVar7->name).str == pcVar1) {
            (pTVar7->name).str = pXVar4;
          }
          pXVar2 = (pTVar7->name).localPart;
          if (pXVar2 != (XML_Char *)0x0) {
            (pTVar7->name).localPart = pXVar4 + ((long)pXVar2 - (long)pcVar1);
          }
          pTVar7->buf = pXVar4;
          pTVar7->bufEnd = pXVar4 + sVar6;
          __dest = pXVar4 + lVar5;
        }
        if (pXVar4 == (XML_Char *)0x0) {
          iVar3 = 1;
          goto LAB_004d9d81;
        }
      }
      memcpy(__dest,pTVar7->rawName,(long)pTVar7->rawNameLength);
      pTVar7->rawName = __dest;
      pTVar7 = pTVar7->parent;
      iVar3 = 0;
    }
LAB_004d9d81:
    if (iVar3 != 0) {
      return iVar3 == 3;
    }
  } while( true );
}

Assistant:

static XML_Bool
storeRawNames(XML_Parser parser)
{
  TAG *tag = tagStack;
  while (tag) {
    int bufSize;
    int nameLen = sizeof(XML_Char) * (tag->name.strLen + 1);
    char *rawNameBuf = tag->buf + nameLen;
    /* Stop if already stored.  Since tagStack is a stack, we can stop
       at the first entry that has already been copied; everything
       below it in the stack is already been accounted for in a
       previous call to this function.
    */
    if (tag->rawName == rawNameBuf)
      break;
    /* For re-use purposes we need to ensure that the
       size of tag->buf is a multiple of sizeof(XML_Char).
    */
    bufSize = nameLen + ROUND_UP(tag->rawNameLength, sizeof(XML_Char));
    if (bufSize > tag->bufEnd - tag->buf) {
      char *temp = (char *)REALLOC(tag->buf, bufSize);
      if (temp == NULL)
        return XML_FALSE;
      /* if tag->name.str points to tag->buf (only when namespace
         processing is off) then we have to update it
      */
      if (tag->name.str == (XML_Char *)tag->buf)
        tag->name.str = (XML_Char *)temp;
      /* if tag->name.localPart is set (when namespace processing is on)
         then update it as well, since it will always point into tag->buf
      */
      if (tag->name.localPart)
        tag->name.localPart = (XML_Char *)temp + (tag->name.localPart -
                                                  (XML_Char *)tag->buf);
      tag->buf = temp;
      tag->bufEnd = temp + bufSize;
      rawNameBuf = temp + nameLen;
    }
    memcpy(rawNameBuf, tag->rawName, tag->rawNameLength);
    tag->rawName = rawNameBuf;
    tag = tag->parent;
  }
  return XML_TRUE;
}